

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

Expression * __thiscall
wasm::OptimizeInstructions::optimizeWrappedResult(OptimizeInstructions *this,Unary *wrap)

{
  Expression *pEVar1;
  undefined1 local_38 [8];
  anon_class_16_2_0755b0ce processChildren;
  Unary *wrap_local;
  bool canOptimize;
  
  processChildren.canOptimize = (bool *)wrap;
  if (wrap->op == WrapInt64) {
    processChildren.wrap = (Unary **)((long)&wrap_local + 7);
    wrap_local._7_1_ = '\x01';
    local_38 = (undefined1  [8])&processChildren.canOptimize;
    pEVar1 = (Expression *)0x0;
    optimizeWrappedResult::anon_class_16_2_0755b0ce::operator()
              ((anon_class_16_2_0755b0ce *)local_38,Scan);
    if (wrap_local._7_1_ == '\x01') {
      optimizeWrappedResult::anon_class_16_2_0755b0ce::operator()
                ((anon_class_16_2_0755b0ce *)local_38,Optimize);
      pEVar1 = *(Expression **)(processChildren.canOptimize + 0x18);
    }
    return pEVar1;
  }
  __assert_fail("wrap->op == WrapInt64",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                ,0xcfa,"Expression *wasm::OptimizeInstructions::optimizeWrappedResult(Unary *)");
}

Assistant:

Expression* optimizeWrappedResult(Unary* wrap) {
    assert(wrap->op == WrapInt64);

    // Core processing logic. This goes through the children, in one of two
    // modes:
    //  * Scan: Find if there is anything we can't handle. Sets |canOptimize|
    //    with what it finds.
    //  * Optimize: Given we can handle everything, update things.
    enum Mode { Scan, Optimize };
    bool canOptimize = true;
    auto processChildren = [&](Mode mode) {
      // Use a simple stack as we go through the children. We use ** as we need
      // to replace children for some optimizations.
      SmallVector<Expression**, 2> stack;
      stack.emplace_back(&wrap->value);

      while (!stack.empty() && canOptimize) {
        auto* currp = stack.back();
        stack.pop_back();
        auto* curr = *currp;
        if (curr->type == Type::unreachable) {
          // Leave unreachability for other passes.
          canOptimize = false;
          return;
        } else if (auto* c = curr->dynCast<Const>()) {
          // A i64 const can be handled by just turning it into an i32.
          if (mode == Optimize) {
            c->value = Literal(int32_t(c->value.getInteger()));
            c->type = Type::i32;
          }
        } else if (auto* unary = curr->dynCast<Unary>()) {
          switch (unary->op) {
            case ExtendSInt32:
            case ExtendUInt32: {
              // Note that there is nothing to push to the stack here: the child
              // is 32-bit already, so we can stop looking. We just need to skip
              // the extend operation.
              if (mode == Optimize) {
                *currp = unary->value;
              }
              break;
            }
            default: {
              // TODO: handle more cases here and below,
              //       https://github.com/WebAssembly/binaryen/issues/5004
              canOptimize = false;
              return;
            }
          }
        } else if (auto* binary = curr->dynCast<Binary>()) {
          // Turn the binary into a 32-bit one, if we can.
          switch (binary->op) {
            case AddInt64:
            case SubInt64:
            case MulInt64: {
              // We can optimize these.
              break;
            }
            default: {
              canOptimize = false;
              return;
            }
          }
          if (mode == Optimize) {
            switch (binary->op) {
              case AddInt64: {
                binary->op = AddInt32;
                break;
              }
              case SubInt64: {
                binary->op = SubInt32;
                break;
              }
              case MulInt64: {
                binary->op = MulInt32;
                break;
              }
              default: {
                WASM_UNREACHABLE("bad op");
              }
            }
            // All things we can optimize change the type to i32.
            binary->type = Type::i32;
          }
          stack.push_back(&binary->left);
          stack.push_back(&binary->right);
        } else {
          // Anything else makes us give up.
          canOptimize = false;
          return;
        }
      }
    };

    processChildren(Scan);
    if (!canOptimize) {
      return nullptr;
    }

    // Optimize, and return the optimized results (in which we no longer need
    // the wrap operation itself).
    processChildren(Optimize);
    return wrap->value;
  }